

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpproxy.cpp
# Opt level: O3

int __thiscall tcpproxy::do_accept(tcpproxy *this,int connectfd)

{
  uint32 *puVar1;
  ushort uVar2;
  naiveconfig *pnVar3;
  uint uVar4;
  uint uVar5;
  int *piVar6;
  uint *puVar7;
  undefined1 local_54 [8];
  sockaddr_in dest_addr;
  uint local_38;
  uint local_34;
  int connectfd_local;
  
  local_38 = connectfd;
  uVar4 = socket(2,1,6);
  local_34 = uVar4;
  bzero((sockaddr *)local_54,0x10);
  local_54._0_2_ = 2;
  pnVar3 = (this->super_proxy).cfg;
  uVar2 = pnVar3->dest_port;
  local_54._2_2_ = uVar2 << 8 | uVar2 >> 8;
  local_54._4_4_ = pnVar3->dest_ipaddr;
  (*(this->super_proxy)._vptr_proxy[7])(this,(ulong)uVar4);
  (*(this->super_proxy)._vptr_proxy[7])(this,(ulong)(uint)connectfd);
  connect(uVar4,(sockaddr *)local_54,0x10);
  piVar6 = __errno_location();
  uVar5 = 0xffffffff;
  if (*piVar6 == 0x73) {
    puVar7 = (uint *)std::__detail::
                     _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)&this->sfh,(key_type *)&local_38);
    uVar5 = local_38;
    *puVar7 = uVar4;
    puVar7 = (uint *)std::__detail::
                     _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)&this->sfh,(key_type *)&local_34);
    uVar4 = local_38;
    *puVar7 = uVar5;
    puVar1 = &((this->super_proxy).cfg)->client_num;
    *puVar1 = *puVar1 + 1;
    dest_addr.sin_zero[4] = (undefined1)local_38;
    dest_addr.sin_zero[5] = local_38._1_1_;
    dest_addr.sin_zero[6] = local_38._2_1_;
    dest_addr.sin_zero[7] = local_38._3_1_;
    dest_addr.sin_zero[0] = '\x01';
    dest_addr.sin_zero[1] = '\0';
    dest_addr.sin_zero[2] = '\0';
    dest_addr.sin_zero[3] = 0x80;
    epoll_ctl(this->epollfd,1,local_38,(epoll_event *)dest_addr.sin_zero);
    (*(this->super_proxy)._vptr_proxy[7])(this,(ulong)uVar4);
    uVar5 = local_34;
    dest_addr.sin_zero[4] = (undefined1)local_34;
    dest_addr.sin_zero[5] = local_34._1_1_;
    dest_addr.sin_zero[6] = local_34._2_1_;
    dest_addr.sin_zero[7] = local_34._3_1_;
    dest_addr.sin_zero[0] = '\x01';
    dest_addr.sin_zero[1] = '\0';
    dest_addr.sin_zero[2] = '\0';
    dest_addr.sin_zero[3] = 0x80;
    epoll_ctl(this->epollfd,1,local_34,(epoll_event *)dest_addr.sin_zero);
    (*(this->super_proxy)._vptr_proxy[7])(this,(ulong)uVar5);
    uVar5 = local_34;
  }
  return uVar5;
}

Assistant:

int tcpproxy::do_accept(int connectfd)
{

    int dest_fd = 0;
    dest_fd = socket(AF_INET, SOCK_STREAM, IPPROTO_TCP);

    struct sockaddr_in dest_addr;
    bzero(&dest_addr, sizeof(dest_addr));
    dest_addr.sin_family = AF_INET;
    dest_addr.sin_port = htons(cfg->dest_port);
    dest_addr.sin_addr.s_addr = cfg->dest_ipaddr;

    setnonblocking(dest_fd);
    setnonblocking(connectfd);
    connect(dest_fd, (struct sockaddr *)&dest_addr, sizeof(dest_addr));
    if (errno != EINPROGRESS)
    {
        //perror("connect");
        return -1;
    }

    sfh[connectfd] = dest_fd;
    sfh[dest_fd] = connectfd;

    //连接计数+1
    cfg->client_num++;

    //将两个socket添加到epoll事件中
    epoll_addfd(connectfd);
    epoll_addfd(dest_fd);

    return dest_fd;
}